

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O2

sexp_conflict
sexp_scheduler(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict root_thread)

{
  nfds_t __nfds;
  sexp psVar1;
  sexp_conflict *ppsVar2;
  sexp_uint_t sVar3;
  anon_union_24768_35_b8e82fc1_for_value *paVar4;
  int iVar5;
  int iVar6;
  sexp psVar7;
  sexp psVar8;
  sexp_mark_stack_ptr_t **ppsVar9;
  sexp psVar10;
  sexp_conflict psVar11;
  long lVar12;
  sexp psVar13;
  long lVar14;
  sexp *ppsVar15;
  sexp psVar16;
  sexp_conflict extraout_RDX;
  sexp_sint_t n_00;
  sexp_conflict extraout_RDX_00;
  long lVar17;
  sexp psVar18;
  sexp psVar19;
  __useconds_t __useconds;
  sexp psVar20;
  uint uVar21;
  long lVar22;
  sexp_conflict psVar23;
  undefined1 auVar24 [16];
  sexp_conflict tmp;
  sexp local_78;
  sexp local_70;
  timeval tval;
  sexp_gc_var_t local_40;
  
  local_40.var = &tmp;
  tmp = (sexp_conflict)0x43e;
  local_40.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_40;
  psVar19 = (ctx->value).type.setters;
  psVar13 = (sexp)(psVar19->value).context.mark_stack[9].prev;
  psVar10 = (sexp)(psVar19->value).context.mark_stack[10].end;
  if (((psVar19->value).context.mark_stack[10].prev != (sexp_mark_stack_ptr_t *)0x1) &&
     (psVar11 = (sexp_conflict)(psVar19->value).context.mark_stack[0xb].start,
     ((ulong)psVar11 & 3) == 0)) {
    if (psVar11->tag == 0x24) {
      if ((psVar11->value).flonum_bits[0x60a3] != '\0') {
        (psVar11->value).flonum_bits[0x60a3] = '\0';
        sexp_thread_start(ctx,self,n,psVar11);
      }
    }
    else if (psVar11->tag == 0x17) {
      tmp = (sexp_conflict)sexp_intern(ctx,"signal-runner",0xffffffffffffffff);
      auVar24 = sexp_env_cell(ctx,psVar11,tmp,0);
      tmp = auVar24._0_8_;
      if (((((auVar24 & (undefined1  [16])0x3) == (undefined1  [16])0x0) && (tmp->tag == 6)) &&
          (psVar11 = (tmp->value).type.cpl, ((ulong)psVar11 & 3) == 0)) && (psVar11->tag == 0x14)) {
        psVar11 = sexp_make_thread(ctx,self,auVar24._8_8_,psVar11,(sexp_conflict)&DAT_0000003e);
        (((ctx->value).type.setters)->value).context.mark_stack[0xb].start =
             (sexp_conflict *)psVar11;
        sexp_thread_start(ctx,self,n_00,psVar11);
        if ((((ulong)psVar13 & 3) != 0) || (psVar13->tag != 6)) {
          psVar13 = (sexp)(((ctx->value).type.setters)->value).context.mark_stack[9].prev;
        }
      }
    }
  }
  psVar19 = (ctx->value).type.setters;
  psVar16 = (sexp)(psVar19->value).context.mark_stack[0xb].end;
  if (((((ulong)psVar16 & 3) == 0) &&
      ((long)(psVar19->value).context.mark_stack[0xc].prev >> 1 == (ulong)psVar16->tag)) &&
     (__nfds = (psVar16->value).string.offset, __nfds != 0)) {
    psVar19 = (psVar16->value).type.name;
    local_78 = psVar16;
    iVar5 = poll((pollfd *)psVar19,__nfds,0);
    uVar21 = (local_78->value).promise.donep;
    psVar16 = local_78;
    do {
      uVar21 = uVar21 - 1;
      if (((int)uVar21 < 0) || (iVar5 < 1)) break;
      psVar18 = (sexp)(ulong)(uVar21 & 0x7fffffff);
      if (0 < *(short *)((long)&psVar19->field_0x6 + (long)psVar18 * 4 * 2)) {
        psVar20 = (ctx->value).opcode.dl;
        local_70 = psVar13;
        if ((((ulong)psVar20 & 3) == 0) && ((psVar20->tag & 0xfffffffe) == 0x10)) {
          psVar13 = (psVar20->value).type.getters;
          if (psVar13 == (sexp)0x0) {
            psVar13 = (psVar20->value).type.slots;
            psVar7 = (sexp)0xffffffffffffffff;
            if ((((ulong)psVar13 & 3) == 0) && (psVar13->tag == 0x12)) {
              psVar7 = (psVar13->value).type.cpl;
            }
          }
          else {
            iVar6 = fileno((FILE *)psVar13);
            psVar7 = (sexp)(long)iVar6;
            psVar16 = local_78;
          }
          if (psVar7 != (sexp)(long)(int)(&psVar19->tag)[(long)psVar18 * 2]) goto LAB_00102e98;
        }
        else {
LAB_00102e98:
          if ((((ulong)psVar20 & 1) == 0) ||
             ((long)psVar20 >> 1 != (long)(int)(&psVar19->tag)[(long)psVar18 * 2]))
          goto LAB_00102eba;
        }
        *(undefined2 *)((long)&ctx->value + 0x60a2) = 0;
        (ctx->value).opcode.dl = (sexp)0x3e;
LAB_00102eba:
        iVar5 = iVar5 + -1;
        psVar13 = psVar10;
        psVar20 = (sexp)0x23e;
LAB_00102ecb:
        do {
          psVar7 = psVar10;
          if ((((ulong)psVar7 & 3) != 0) || (psVar7->tag != 6)) {
            sVar3 = (psVar16->value).string.offset;
            psVar10 = (sexp)(sVar3 - 1);
            if (psVar18 < psVar10) {
              *(pollfd *)(&psVar19->tag + (long)psVar18 * 2) =
                   *(pollfd *)((long)psVar19 + (sVar3 - 1) * 8);
              psVar10 = (sexp)((psVar16->value).string.offset - 1);
            }
            (psVar16->value).type.cpl = psVar10;
            psVar10 = psVar13;
            psVar13 = local_70;
            break;
          }
          psVar10 = (((psVar7->value).type.name)->value).opcode.dl;
          if ((((ulong)psVar10 & 3) == 0) && ((psVar10->tag & 0xfffffffe) == 0x10)) {
            psVar1 = (psVar10->value).type.getters;
            if (psVar1 == (sexp)0x0) {
              psVar1 = (psVar10->value).type.slots;
              psVar8 = (sexp)0xffffffffffffffff;
              if ((((ulong)psVar1 & 3) == 0) && (psVar1->tag == 0x12)) {
                psVar8 = (psVar1->value).type.cpl;
              }
            }
            else {
              iVar6 = fileno((FILE *)psVar1);
              psVar8 = (sexp)(long)iVar6;
              psVar16 = local_78;
            }
            if (psVar8 != (sexp)(long)(int)(&psVar19->tag)[(long)psVar18 * 2]) goto LAB_00102f60;
          }
          else {
LAB_00102f60:
            if ((((ulong)psVar10 & 1) == 0) ||
               ((long)psVar10 >> 1 != (long)(int)(&psVar19->tag)[(long)psVar18 * 2]))
            goto LAB_0010300c;
          }
          (((psVar7->value).type.name)->value).flonum_bits[0x60a3] = '\0';
          (((psVar7->value).type.name)->value).flonum_bits[0x60a2] = '\0';
          (((psVar7->value).type.name)->value).opcode.dl = (sexp)0x3e;
          tmp = (psVar7->value).type.cpl;
          paVar4 = &psVar20->value;
          if (psVar20 == (sexp)0x23e) {
            paVar4 = (anon_union_24768_35_b8e82fc1_for_value *)
                     ((((ctx->value).type.setters)->value).context.mark_stack + 10);
            psVar13 = tmp;
          }
          (paVar4->type).cpl = tmp;
          (psVar7->value).string.offset = 0x23e;
          psVar10 = tmp;
          if ((psVar7->value).type.name != ctx) {
            psVar1 = (ctx->value).type.setters;
            ppsVar2 = (psVar1->value).context.mark_stack[10].start;
            if ((((ulong)ppsVar2 & 3) == 0) && (*(int *)ppsVar2 == 6)) {
              ppsVar9 = (sexp_mark_stack_ptr_t **)(ppsVar2 + 2);
            }
            else {
              ppsVar9 = &(psVar1->value).context.mark_stack[9].prev;
              local_70 = psVar7;
            }
            *ppsVar9 = (sexp_mark_stack_ptr_t *)psVar7;
            (((ctx->value).type.setters)->value).context.mark_stack[10].start =
                 (sexp_conflict *)psVar7;
          }
        } while( true );
      }
    } while( true );
  }
  psVar19 = psVar10;
  if ((ctx->value).context.refuel < 1) {
    psVar16 = (sexp)0x23e;
    do {
      psVar18 = psVar10;
      while( true ) {
        if ((((ulong)psVar18 & 3) != 0) || (psVar18->tag != 6)) goto LAB_00103110;
        psVar10 = (psVar18->value).type.name;
        if ((psVar10->value).opcode.dl != ctx) break;
        (psVar10->value).flonum_bits[0x60a3] = '\0';
        (((psVar18->value).type.name)->value).flonum_bits[0x60a2] = '\0';
        tmp = (psVar18->value).type.cpl;
        paVar4 = &psVar16->value;
        if (psVar16 == (sexp)0x23e) {
          paVar4 = (anon_union_24768_35_b8e82fc1_for_value *)
                   ((((ctx->value).type.setters)->value).context.mark_stack + 10);
          psVar19 = tmp;
        }
        (paVar4->type).cpl = tmp;
        (psVar18->value).string.offset = 0x23e;
        psVar10 = (ctx->value).type.setters;
        ppsVar2 = (psVar10->value).context.mark_stack[10].start;
        if ((((ulong)ppsVar2 & 3) == 0) && (*(int *)ppsVar2 == 6)) {
          ppsVar9 = (sexp_mark_stack_ptr_t **)(ppsVar2 + 2);
        }
        else {
          ppsVar9 = &(psVar10->value).context.mark_stack[9].prev;
          psVar13 = psVar18;
        }
        *ppsVar9 = (sexp_mark_stack_ptr_t *)psVar18;
        (((ctx->value).type.setters)->value).context.mark_stack[10].start = (sexp_conflict *)psVar18
        ;
        psVar18 = tmp;
      }
      psVar10 = (psVar18->value).type.cpl;
      psVar16 = psVar18;
    } while( true );
  }
LAB_00103110:
  if (((((ulong)psVar19 & 3) == 0) && (psVar19->tag == 6)) &&
     (iVar5 = gettimeofday((timeval *)&tval,(__timezone_ptr_t)0x0), psVar16 = extraout_RDX,
     iVar5 == 0)) {
    psVar10 = (sexp)0x23e;
    for (psVar18 = psVar19; (((ulong)psVar18 & 3) == 0 && (psVar18->tag == 6));
        psVar18 = (psVar18->value).type.cpl) {
      psVar16 = (psVar18->value).type.name;
      lVar12 = (psVar16->value).context.tval.tv_sec;
      if (((lVar12 == 0) && ((psVar16->value).context.tval.tv_usec == 0)) ||
         ((tval.tv_sec <= lVar12 &&
          ((lVar12 != tval.tv_sec || (tval.tv_usec <= (psVar16->value).context.tval.tv_usec))))))
      break;
      (psVar16->value).flonum_bits[0x60a2] = '\x01';
      (((psVar18->value).type.name)->value).flonum_bits[0x60a3] = '\0';
      psVar10 = psVar18;
    }
    psVar16 = (sexp)tval.tv_usec;
    if ((((ulong)psVar10 & 2) == 0) && (psVar10->tag == 6)) {
      (psVar10->value).string.offset = 0x23e;
      psVar20 = (ctx->value).type.setters;
      psVar16 = (sexp)(psVar20->value).context.mark_stack[10].start;
      if ((((ulong)psVar16 & 3) == 0) && (psVar16->tag == 6)) {
        ppsVar15 = &(psVar16->value).type.cpl;
        psVar16 = (sexp)ppsVar15;
      }
      else {
        ppsVar15 = (sexp *)&(psVar20->value).context.mark_stack[9].prev;
        psVar13 = psVar19;
      }
      *ppsVar15 = psVar19;
      (((ctx->value).type.setters)->value).context.mark_stack[10].start = (sexp_conflict *)psVar10;
      (((ctx->value).type.setters)->value).context.mark_stack[10].end = (sexp_conflict *)psVar18;
      psVar19 = psVar18;
    }
  }
  if (((ulong)psVar13 & 3) == 0) {
    lVar12 = (ctx->value).context.refuel;
    if (psVar13->tag != 6) goto LAB_0010336d;
    psVar11 = (psVar13->value).type.name;
    if (lVar12 < 1) {
      psVar10 = (ctx->value).type.setters;
LAB_0010344a:
      psVar19 = (psVar13->value).type.cpl;
      (psVar10->value).context.mark_stack[9].prev = (sexp_mark_stack_ptr_t *)psVar19;
      if ((((ulong)psVar19 & 3) != 0) || (psVar19->tag != 6)) {
        (((ctx->value).type.setters)->value).context.mark_stack[10].start = (sexp_conflict *)0x23e;
      }
      if (0 < (ctx->value).context.refuel) {
        auVar24 = sexp_memq_op(ctx,0,2,ctx);
        psVar16 = auVar24._8_8_;
        if (auVar24._0_8_ == 0x3e) {
          sexp_insert_timed(ctx,ctx,(sexp_conflict)&DAT_0000003e);
          psVar16 = extraout_RDX_00;
        }
      }
      psVar19 = (sexp)(((ctx->value).type.setters)->value).context.mark_stack[10].end;
    }
    else {
      psVar10 = (ctx->value).type.setters;
      if ((ctx->value).flonum_bits[0x60a3] != '\0') goto LAB_0010344a;
      ((psVar10->value).context.mark_stack[9].prev)->end = (sexp_conflict *)ctx;
      psVar13 = (ctx->value).type.setters;
      (psVar13->value).context.mark_stack[10].start[2] =
           (sexp_conflict)(psVar13->value).context.mark_stack[9].prev;
      psVar13 = (ctx->value).type.setters;
      (psVar13->value).context.mark_stack[9].prev =
           ((psVar13->value).context.mark_stack[9].prev)->prev;
      psVar13 = (ctx->value).type.setters;
      (psVar13->value).context.mark_stack[10].start =
           (sexp_conflict *)(psVar13->value).context.mark_stack[10].start[2];
      (((ctx->value).type.setters)->value).context.mark_stack[10].start[2] = (sexp_conflict)0x23e;
    }
  }
  else {
    lVar12 = (ctx->value).context.refuel;
LAB_0010336d:
    psVar13 = psVar19;
    psVar11 = ctx;
    if (lVar12 < 1) {
      for (; (psVar11 = ctx, ((ulong)psVar13 & 3) == 0 && (psVar13->tag == 6));
          psVar13 = (psVar13->value).type.cpl) {
        psVar11 = (psVar13->value).type.name;
        psVar10 = (psVar11->value).opcode.dl;
        if ((((ulong)psVar10 & 1) != 0) ||
           ((((ulong)psVar10 & 2) == 0 && ((psVar10->tag & 0xfffffffe) == 0x10)))) break;
      }
    }
  }
  psVar23 = psVar11;
  if ((psVar11->value).flonum_bits[0x60a3] == '\0') goto LAB_00103547;
  if ((((ulong)psVar19 & 3) == 0) && (psVar19->tag == 6)) {
    psVar23 = (psVar19->value).type.name;
    lVar12 = (psVar23->value).context.tval.tv_sec;
    if (((lVar12 == 0) && ((psVar23->value).context.tval.tv_usec == 0)) ||
       ((lVar22 = (psVar11->value).context.tval.tv_sec, lVar22 <= lVar12 &&
        ((lVar12 != lVar22 ||
         ((psVar11->value).context.tval.tv_usec <= (psVar23->value).context.tval.tv_usec))))))
    goto LAB_001034c2;
    (((ctx->value).type.setters)->value).context.mark_stack[10].end =
         (sexp_conflict *)(psVar19->value).type.cpl;
    tmp = psVar11;
    lVar12 = sexp_memq_op(ctx,0,2,psVar11);
    if (lVar12 == 0x3e) {
      sexp_insert_timed(ctx,tmp,tmp);
    }
  }
  else {
LAB_001034c2:
    sexp_delete_list(ctx,(int)psVar11,psVar16);
    psVar23 = psVar11;
  }
  if (((psVar23->value).context.tval.tv_sec == 0) && ((psVar23->value).context.tval.tv_usec == 0)) {
    __useconds = 10000;
  }
  else {
    lVar22 = 0;
    gettimeofday((timeval *)&tval,(__timezone_ptr_t)0x0);
    lVar12 = (psVar23->value).context.tval.tv_sec;
    lVar14 = lVar12 - tval.tv_sec;
    if (tval.tv_sec <= lVar12) {
      lVar12 = (psVar23->value).context.tval.tv_usec;
      lVar17 = lVar12 - tval.tv_usec;
      lVar22 = 0;
      if (lVar17 != 0 && tval.tv_usec <= lVar12) {
        lVar22 = lVar17;
      }
      if (0 < lVar14) {
        lVar22 = lVar17;
      }
      lVar22 = lVar22 + lVar14 * 1000000;
      __useconds = 10000;
      if (10000 < lVar22) goto LAB_00103542;
    }
    *(undefined2 *)((long)&psVar23->value + 0x60a2) = 1;
    __useconds = (__useconds_t)lVar22;
  }
LAB_00103542:
  usleep(__useconds);
LAB_00103547:
  (ctx->value).context.saves = local_40.next;
  return psVar23;
LAB_0010300c:
  psVar10 = (psVar7->value).type.cpl;
  psVar20 = psVar7;
  goto LAB_00102ecb;
}

Assistant:

sexp sexp_scheduler (sexp ctx, sexp self, sexp_sint_t n, sexp root_thread) {
  int i, k;
  struct timeval tval;
  struct pollfd *pfds;
  suseconds_t usecs = 0;
  sexp res, ls1, ls2, evt, runner, paused, front, pollfds;
  sexp_gc_var1(tmp);
  sexp_gc_preserve1(ctx, tmp);

  front  = sexp_global(ctx, SEXP_G_THREADS_FRONT);
  paused = sexp_global(ctx, SEXP_G_THREADS_PAUSED);

  /* check signals */
  if (sexp_global(ctx, SEXP_G_THREADS_SIGNALS) != SEXP_ZERO) {
    runner = sexp_global(ctx, SEXP_G_THREADS_SIGNAL_RUNNER);
    if (! sexp_contextp(runner)) { /* ensure the runner exists */
      if (sexp_envp(runner)) {
        tmp = sexp_env_cell(ctx, runner, (tmp=sexp_intern(ctx, "signal-runner", -1)), 0);
        if (sexp_pairp(tmp) && sexp_procedurep(sexp_cdr(tmp))) {
          runner = sexp_make_thread(ctx, self, 2, sexp_cdr(tmp), SEXP_FALSE);
          sexp_global(ctx, SEXP_G_THREADS_SIGNAL_RUNNER) = runner;
          sexp_thread_start(ctx, self, 1, runner);
          if (!sexp_pairp(front))
            front = sexp_global(ctx, SEXP_G_THREADS_FRONT);
        }
      }
    } else if (sexp_context_waitp(runner)) { /* wake it if it's sleeping */
      sexp_context_waitp(runner) = 0;
      sexp_thread_start(ctx, self, 1, runner);
    }
  }

  /* check blocked fds */
  pollfds = sexp_global(ctx, SEXP_G_THREADS_POLL_FDS);
  if (sexp_pollfdsp(ctx, pollfds) && sexp_pollfds_num_fds(pollfds) > 0) {
    pfds = sexp_pollfds_fds(pollfds);
    k = poll(sexp_pollfds_fds(pollfds), sexp_pollfds_num_fds(pollfds), 0);
    for (i=sexp_pollfds_num_fds(pollfds)-1; i>=0 && k>0; --i) {
      if (pfds[i].revents > 0) { /* free all threads blocked on this fd */
        k--;
        /* maybe unblock the current thread */
        evt = sexp_context_event(ctx);
        if ((sexp_portp(evt) && (sexp_port_fileno(evt) == pfds[i].fd))
            || (sexp_fixnump(evt) && (sexp_unbox_fixnum(evt) == pfds[i].fd))) {
          sexp_context_waitp(ctx) = 0;
          sexp_context_timeoutp(ctx) = 0;
          sexp_context_event(ctx) = SEXP_FALSE;
        }
        /* maybe unblock paused threads */
        for (ls1=SEXP_NULL, ls2=paused; sexp_pairp(ls2); ) {
          /* TODO: distinguish input and output on the same fd? */
          evt = sexp_context_event(sexp_car(ls2));
          if ((sexp_portp(evt) && sexp_port_fileno(evt) == pfds[i].fd)
              || (sexp_fixnump(evt) && sexp_unbox_fixnum(evt) == pfds[i].fd)) {
            sexp_context_waitp(sexp_car(ls2)) = 0;
            sexp_context_timeoutp(sexp_car(ls2)) = 0;
            sexp_context_event(sexp_car(ls2)) = SEXP_FALSE;
            if (ls1==SEXP_NULL)
              sexp_global(ctx, SEXP_G_THREADS_PAUSED) = paused = sexp_cdr(ls2);
            else
              sexp_cdr(ls1) = sexp_cdr(ls2);
            tmp = sexp_cdr(ls2);
            sexp_cdr(ls2) = SEXP_NULL;
            if (sexp_car(ls2) != ctx) {
              if (! sexp_pairp(sexp_global(ctx, SEXP_G_THREADS_BACK))) {
                sexp_global(ctx, SEXP_G_THREADS_FRONT) = front = ls2;
              } else {
                sexp_cdr(sexp_global(ctx, SEXP_G_THREADS_BACK)) = ls2;
              }
              sexp_global(ctx, SEXP_G_THREADS_BACK) = ls2;
            }
            ls2 = tmp;
          } else {
            ls1 = ls2;
            ls2 = sexp_cdr(ls2);
          }
        }
        if (i < (sexp_pollfds_num_fds(pollfds) - 1)) {
          pfds[i] = pfds[sexp_pollfds_num_fds(pollfds) - 1];
        }
        sexp_pollfds_num_fds(pollfds) -= 1;
      }
    }
  }

  /* if we've terminated, check threads joining us */
  if (sexp_context_refuel(ctx) <= 0) {
    for (ls1=SEXP_NULL, ls2=paused; sexp_pairp(ls2); ) {
      if (sexp_context_event(sexp_car(ls2)) == ctx) {
        sexp_context_waitp(sexp_car(ls2)) = 0;
        sexp_context_timeoutp(sexp_car(ls2)) = 0;
        if (ls1==SEXP_NULL)
          sexp_global(ctx, SEXP_G_THREADS_PAUSED) = paused = sexp_cdr(ls2);
        else
          sexp_cdr(ls1) = sexp_cdr(ls2);
        tmp = sexp_cdr(ls2);
        sexp_cdr(ls2) = SEXP_NULL;
        if (! sexp_pairp(sexp_global(ctx, SEXP_G_THREADS_BACK))) {
          sexp_global(ctx, SEXP_G_THREADS_FRONT) = front = ls2;
        } else {
          sexp_cdr(sexp_global(ctx, SEXP_G_THREADS_BACK)) = ls2;
        }
        sexp_global(ctx, SEXP_G_THREADS_BACK) = ls2;
        ls2 = tmp;
      } else {
        ls1 = ls2;
        ls2 = sexp_cdr(ls2);
      }
    }
  }

  /* check timeouts */
  if (sexp_pairp(paused)) {
    if (gettimeofday(&tval, NULL) == 0) {
      ls1 = SEXP_NULL;
      ls2 = paused;
      while (sexp_pairp(ls2) && sexp_context_before(sexp_car(ls2), tval)) {
        sexp_context_timeoutp(sexp_car(ls2)) = 1;
        sexp_context_waitp(sexp_car(ls2)) = 0;
        ls1 = ls2;
        ls2 = sexp_cdr(ls2);
      }
      if (sexp_pairp(ls1)) {
        sexp_cdr(ls1) = SEXP_NULL;
        if (! sexp_pairp(sexp_global(ctx, SEXP_G_THREADS_BACK))) {
          sexp_global(ctx, SEXP_G_THREADS_FRONT) = front = paused;
        } else {
          sexp_cdr(sexp_global(ctx, SEXP_G_THREADS_BACK)) = paused;
        }
        sexp_global(ctx, SEXP_G_THREADS_BACK) = ls1;
        sexp_global(ctx, SEXP_G_THREADS_PAUSED) = paused = ls2;
      }
    }
  }

  /* dequeue next thread */
  if (sexp_pairp(front)) {
    res = sexp_car(front);
    if ((sexp_context_refuel(ctx) <= 0) || sexp_context_waitp(ctx)) {
      /* orig ctx is either terminated or paused */
      sexp_global(ctx, SEXP_G_THREADS_FRONT) = sexp_cdr(front);
      if (! sexp_pairp(sexp_cdr(front)))
        sexp_global(ctx, SEXP_G_THREADS_BACK) = SEXP_NULL;
      if (sexp_context_refuel(ctx) > 0 && sexp_not(sexp_memq(ctx, ctx, paused)))
        sexp_insert_timed(ctx, ctx, SEXP_FALSE);
      paused = sexp_global(ctx, SEXP_G_THREADS_PAUSED);
    } else {
      /* swap with front of queue */
      sexp_car(sexp_global(ctx, SEXP_G_THREADS_FRONT)) = ctx;
      /* rotate front of queue to back */
      sexp_cdr(sexp_global(ctx, SEXP_G_THREADS_BACK))
        = sexp_global(ctx, SEXP_G_THREADS_FRONT);
      sexp_global(ctx, SEXP_G_THREADS_FRONT)
        = sexp_cdr(sexp_global(ctx, SEXP_G_THREADS_FRONT));
      sexp_global(ctx, SEXP_G_THREADS_BACK)
        = sexp_cdr(sexp_global(ctx, SEXP_G_THREADS_BACK));
      sexp_cdr(sexp_global(ctx, SEXP_G_THREADS_BACK)) = SEXP_NULL;
    }
  } else {
    /* no threads to dequeue */
    res = ctx;
    /* prefer a thread we can wait on instead of spinning */
    if (sexp_context_refuel(ctx) <= 0) {
      for (ls1=paused; sexp_pairp(ls1); ls1=sexp_cdr(ls1)) {
        evt = sexp_context_event(sexp_car(ls1));
        if (sexp_fixnump(evt) || sexp_portp(evt)) {
          res = sexp_car(ls1);
          break;
        }
      }
    }
  }

  if (sexp_context_waitp(res)) {
    /* the only thread available was waiting */
    /* TODO: if another thread is blocked on I/O, wait on that with
     * the appropriate minimum timeout */
    if (sexp_pairp(paused)
        && sexp_context_before(sexp_car(paused), sexp_context_timeval(res))) {
      tmp = res;
      res = sexp_car(paused);
      paused = sexp_global(ctx, SEXP_G_THREADS_PAUSED) = sexp_cdr(paused);
      if (sexp_not(sexp_memq(ctx, tmp, paused)))
        sexp_insert_timed(ctx, tmp, tmp);
    } else {
      sexp_delete_list(ctx, SEXP_G_THREADS_PAUSED, res);
    }
    paused = sexp_global(ctx, SEXP_G_THREADS_PAUSED);
    usecs = 0;
    if ((sexp_context_timeval(res).tv_sec == 0)
        && (sexp_context_timeval(res).tv_usec == 0)) {
      /* no timeout, wait for default 10ms */
      usecs = 10*1000;
    } else {
      /* wait until the next timeout, or at most 10ms */
      gettimeofday(&tval, NULL);
      if (tval.tv_sec <= sexp_context_timeval(res).tv_sec) {
        usecs = (sexp_context_timeval(res).tv_sec - tval.tv_sec) * 1000000;
        if (tval.tv_usec < sexp_context_timeval(res).tv_usec || usecs > 0)
          usecs += sexp_context_timeval(res).tv_usec - tval.tv_usec;
      }
      if (usecs > 10*1000) {
        usecs = 10*1000;
      } else {
        sexp_context_waitp(res) = 0;
        sexp_context_timeoutp(res) = 1;
      }
    }
    /* take a nap to avoid busy looping */
    usleep(usecs);
  }

  sexp_gc_release1(ctx);
  return res;
}